

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O3

int dsa_pub_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  int iVar1;
  DSA *r;
  BIGNUM *ret;
  int line;
  
  if (params->len == 0) {
    r = DSA_new();
    if (r == (DSA *)0x0) {
      return 0;
    }
LAB_004c0e85:
    ret = BN_new();
    r->p = ret;
    if (ret == (BIGNUM *)0x0) goto LAB_004c0ec7;
    iVar1 = BN_parse_asn1_unsigned(key,(BIGNUM *)ret);
    line = 0x33;
    if ((iVar1 != 0) && (key->len == 0)) {
      evp_pkey_set_method(out,&dsa_asn1_meth);
      out->pkey = r;
      return 1;
    }
  }
  else {
    r = (DSA *)DSA_parse_parameters(params);
    if (r == (DSA *)0x0) {
      ERR_put_error(6,0,0x66,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                    ,0x28);
      return 0;
    }
    line = 0x28;
    if (params->len == 0) goto LAB_004c0e85;
  }
  ERR_put_error(6,0,0x66,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                ,line);
LAB_004c0ec7:
  DSA_free(r);
  return 0;
}

Assistant:

static int dsa_pub_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 3279, section 2.3.2.

  // Parameters may or may not be present.
  bssl::UniquePtr<DSA> dsa;
  if (CBS_len(params) == 0) {
    dsa.reset(DSA_new());
    if (dsa == nullptr) {
      return 0;
    }
  } else {
    dsa.reset(DSA_parse_parameters(params));
    if (dsa == nullptr || CBS_len(params) != 0) {
      OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
      return 0;
    }
  }

  dsa->pub_key = BN_new();
  if (dsa->pub_key == nullptr) {
    return 0;
  }

  if (!BN_parse_asn1_unsigned(key, dsa->pub_key) || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  EVP_PKEY_assign_DSA(out, dsa.release());
  return 1;
}